

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_unit_ops.cpp
# Opt level: O0

void __thiscall unitOps_nan_Test::~unitOps_nan_Test(unitOps_nan_Test *this)

{
  unitOps_nan_Test *this_local;
  
  ~unitOps_nan_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(unitOps, nan)
{
    EXPECT_TRUE(isnan(invalid));
    EXPECT_FALSE(isnan(defunit));
    auto zunit = unit(0.0, m);
    auto zunit2 = unit(0.0, kg);
    auto nunit = zunit2 / zunit;
    EXPECT_TRUE(isnan(nunit));
    EXPECT_TRUE(isnan(unit_cast(precise::invalid)));
}